

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

bool __thiscall HawkTracer::parser::ProtocolReader::start(ProtocolReader *this)

{
  uint uVar1;
  pointer pSVar2;
  bool bVar3;
  type local_28;
  thread local_20;
  ProtocolReader *local_18;
  ProtocolReader *this_local;
  
  local_18 = this;
  pSVar2 = std::
           unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
           ::operator->(&this->_stream);
  uVar1 = (*pSVar2->_vptr_Stream[4])();
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    std::atomic<bool>::operator=(&this->_is_running,true);
    local_28.this = this;
    std::thread::thread<HawkTracer::parser::ProtocolReader::start()::__0,,void>(&local_20,&local_28)
    ;
    std::thread::operator=(&this->_thread,&local_20);
    std::thread::~thread(&local_20);
  }
  return bVar3;
}

Assistant:

bool ProtocolReader::start()
{
    if (_stream->start())
    {
        _is_running = true;
        _thread = std::thread([this] { _read_events(); });
        return true;
    }

    return false;
}